

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_example_json.h
# Opt level: O0

BaseState<false> * __thiscall
LabelSinglePropertyState<false>::Float
          (LabelSinglePropertyState<false> *this,Context<false> *ctx,float v)

{
  BaseState<false> *pBVar1;
  LabelObjectState<false> *in_RSI;
  undefined4 in_XMM0_Da;
  float in_stack_ffffffffffffffdc;
  undefined4 in_stack_ffffffffffffffe0;
  BaseState<false> *local_8;
  
  in_RSI->return_state = (BaseState<false> *)((long)&in_RSI->return_state->_vptr_BaseState + 7);
  (in_RSI->cb_label).cost = (float)((int)(in_RSI->cb_label).cost + -7);
  pBVar1 = LabelObjectState<false>::Float
                     (in_RSI,(Context<false> *)CONCAT44(in_XMM0_Da,in_stack_ffffffffffffffe0),
                      in_stack_ffffffffffffffdc);
  if (pBVar1 == (BaseState<false> *)0x0) {
    local_8 = (BaseState<false> *)0x0;
  }
  else {
    local_8 = *(BaseState<false> **)&in_RSI->found;
  }
  return local_8;
}

Assistant:

BaseState<audit>* Float(Context<audit>& ctx, float v)
  {
    // skip "_label_"
    ctx.key += 7;
    ctx.key_length -= 7;

    if (ctx.label_object_state.Float(ctx, v) == nullptr)
      return nullptr;

    return ctx.previous_state;
  }